

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O2

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_node
          (DG2Dot<dg::LLVMNode> *this,LLVMNode *node,int ind,char *prefix)

{
  ofstream *os;
  uint32_t uVar1;
  uint uVar2;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *pNVar3;
  int iVar4;
  ostream *poVar5;
  size_type sVar6;
  _Rb_tree_node_base *p_Var7;
  char *pcVar8;
  Indent Ind;
  LLVMNode *local_40;
  int local_38;
  Indent local_34;
  
  uVar1 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).slice_id;
  uVar2 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).analysisAuxData.
          dfsorder;
  os = &this->out;
  local_40 = node;
  local_38 = ind;
  local_34.ind = ind;
  operator<<((ostream *)os,&local_34);
  poVar5 = std::operator<<((ostream *)os,"NODE");
  poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
  std::operator<<(poVar5," [label=\"");
  if (prefix != (char *)0x0) {
    poVar5 = std::operator<<((ostream *)os,prefix);
    std::operator<<(poVar5," ");
  }
  (**this->_vptr_DG2Dot)
            (this,os,(node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key);
  if ((node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs._M_t.
      _M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar5 = std::operator<<((ostream *)os,"\\nsubgraphs: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  if (uVar2 != 0) {
    poVar5 = std::operator<<((ostream *)os,"\\ndfs order: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<((ostream *)os,"\\nbfs order: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  if (uVar1 != 0) {
    poVar5 = std::operator<<((ostream *)os,"\\nslice: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  iVar4 = (*this->_vptr_DG2Dot[1])(this,os,node);
  std::operator<<((ostream *)os,"\" ");
  if ((char)iVar4 == '\0') {
    sVar6 = std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
            count(&this->criteria,&local_40);
    if (sVar6 == 0) {
      if (uVar1 == 0) {
        pcVar8 = "style=filled fillcolor=white";
      }
      else {
        pcVar8 = "style=filled fillcolor=greenyellow";
      }
    }
    else {
      pcVar8 = "style=filled fillcolor=orange";
    }
  }
  else {
    pcVar8 = "style=filled fillcolor=red";
  }
  std::operator<<((ostream *)os,pcVar8);
  std::operator<<((ostream *)os,"]\n");
  dump_parameters(this,local_40,local_38);
  if (((local_40->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs._M_t.
       _M_impl.super__Rb_tree_header._M_node_count != 0) && ((this->options & 0x400) != 0)) {
    pNVar3 = &local_40->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>;
    for (p_Var7 = (local_40->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                  subgraphs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(pNVar3->subgraphs)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      operator<<((ostream *)os,&local_34);
      poVar5 = std::operator<<((ostream *)os,"NODE");
      poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
      poVar5 = std::operator<<(poVar5," -> NODE");
      poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
      poVar5 = std::operator<<(poVar5," [label=\"call\"");
      poVar5 = std::operator<<(poVar5,"  lhead=cluster_");
      poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
      std::operator<<(poVar5," penwidth=3 style=dashed]\n");
    }
  }
  return;
}

Assistant:

void dump_node(NodeT *node, int ind = 1, const char *prefix = nullptr) {
        bool err = false;
        unsigned int dfsorder = node->getDFSOrder();
        unsigned int bfsorder = node->getDFSOrder();
        uint32_t slice_id = node->getSlice();
        Indent Ind(ind);

        out << Ind << "NODE" << node << " [label=\"";

        if (prefix)
            out << prefix << " ";

        printKey(out, node->getKey());

        if (node->hasSubgraphs())
            out << "\\nsubgraphs: " << node->subgraphsNum();
        if (dfsorder != 0)
            out << "\\ndfs order: " << dfsorder;
        if (bfsorder != 0)
            out << "\\nbfs order: " << bfsorder;

        if (slice_id != 0)
            out << "\\nslice: " << slice_id;

        // check if the node is OK, and if not
        // highlight it
        err = checkNode(out, node);

        // end of label
        out << "\" ";

        if (err) {
            out << "style=filled fillcolor=red";
        } else if (criteria.count(node) > 0) {
            out << "style=filled fillcolor=orange";
        } else if (slice_id != 0)
            out << "style=filled fillcolor=greenyellow";
        else
            out << "style=filled fillcolor=white";

        out << "]\n";

        dump_parameters(node, ind);
        if (node->hasSubgraphs() && (options & PRINT_CALL)) {
            // add call-site to callee edges
            for (auto subgraph : node->getSubgraphs()) {
                out << Ind << "NODE" << node << " -> NODE"
                    << subgraph->getEntry() << " [label=\"call\""
                    << "  lhead=cluster_" << subgraph
                    << " penwidth=3 style=dashed]\n";
            }
        }
    }